

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O3

void __thiscall cfd::core::Transaction::RemoveTxIn(Transaction *this,uint32_t index)

{
  AbstractTransaction::RemoveTxIn(&this->super_AbstractTransaction,index);
  ::std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::_M_erase
            (&this->vin_,
             (this->vin_).super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
             _M_impl.super__Vector_impl_data._M_start + index);
  (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[10])(this,4);
  return;
}

Assistant:

void Transaction::RemoveTxIn(uint32_t index) {
  AbstractTransaction::RemoveTxIn(index);

  std::vector<TxIn>::const_iterator ite = vin_.cbegin();
  if (index != 0) {
    ite += index;
  }
  vin_.erase(ite);
  CallbackStateChange(kStateChangeRemoveTxIn);
}